

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<_drmModeModeInfo>::emplace<_drmModeModeInfo_const&>
          (QPodArrayOps<_drmModeModeInfo> *this,qsizetype i,_drmModeModeInfo *args)

{
  _drmModeModeInfo **pp_Var1;
  qsizetype *pqVar2;
  Data *pDVar3;
  _drmModeModeInfo *p_Var4;
  long lVar5;
  GrowthPosition where;
  uint32_t *puVar6;
  long in_FS_OFFSET;
  byte bVar7;
  uint32_t local_6c [17];
  long local_28;
  
  bVar7 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<_drmModeModeInfo>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011da5d:
    puVar6 = local_6c;
    for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar6 = args->clock;
      args = (_drmModeModeInfo *)&args->hdisplay;
      puVar6 = puVar6 + 1;
    }
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<_drmModeModeInfo>).size != 0);
    QArrayDataPointer<_drmModeModeInfo>::detachAndGrow
              (&this->super_QArrayDataPointer<_drmModeModeInfo>,where,1,(_drmModeModeInfo **)0x0,
               (QArrayDataPointer<_drmModeModeInfo> *)0x0);
    p_Var4 = createHole(this,where,i,1);
    puVar6 = local_6c;
    for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
      p_Var4->clock = *puVar6;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
      p_Var4 = (_drmModeModeInfo *)((long)p_Var4 + (ulong)bVar7 * -8 + 4);
    }
  }
  else {
    if (((this->super_QArrayDataPointer<_drmModeModeInfo>).size == i) &&
       (p_Var4 = (this->super_QArrayDataPointer<_drmModeModeInfo>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)p_Var4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) *
       -0xf0f0f0f0f0f0f0f)) {
      p_Var4 = p_Var4 + i;
      for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
        p_Var4->clock = args->clock;
        args = (_drmModeModeInfo *)&args->hdisplay;
        p_Var4 = (_drmModeModeInfo *)&p_Var4->hdisplay;
      }
    }
    else {
      if ((i != 0) ||
         (p_Var4 = (this->super_QArrayDataPointer<_drmModeModeInfo>).ptr,
         (_drmModeModeInfo *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == p_Var4))
      goto LAB_0011da5d;
      p_Var4 = p_Var4 + -1;
      for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
        p_Var4->clock = args->clock;
        args = (_drmModeModeInfo *)&args->hdisplay;
        p_Var4 = (_drmModeModeInfo *)&p_Var4->hdisplay;
      }
      pp_Var1 = &(this->super_QArrayDataPointer<_drmModeModeInfo>).ptr;
      *pp_Var1 = *pp_Var1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<_drmModeModeInfo>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }